

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int iVar3;
  _Alloc_hider _Var4;
  char cVar5;
  long lVar6;
  ostream *poVar7;
  char **ppcVar8;
  pointer pRVar9;
  int *piVar10;
  undefined8 uVar11;
  _Alloc_hider __endptr;
  string user_max_report;
  string sequence;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> repeats;
  string local_d8;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  int local_94;
  ulonglong local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> local_68;
  string local_50;
  
  local_88._M_allocated_capacity = (size_type)&local_78;
  local_88._8_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_88._M_local_buf,cVar5);
  __endptr._M_p = (pointer)&local_88;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,detail::CapitaliseBase>
            (local_88._M_allocated_capacity,
             (char *)(local_88._M_allocated_capacity + local_88._8_8_),
             local_88._M_allocated_capacity);
  lVar6 = std::__cxx11::string::find_first_not_of(__endptr._M_p,0x10f2b3,0);
  if ((lVar6 != -1) &&
     (lVar6 = std::__cxx11::string::find_first_not_of(local_88._M_local_buf,0x10f2b9,0), lVar6 != -1
     )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"this example is only for DNA or RNA sequences",0x2d);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(0);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_88._M_allocated_capacity,
             (char *)(local_88._M_allocated_capacity + local_88._8_8_));
  get_repeats(&local_68,&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Found ",6);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," tandem repeats!",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-a","");
  end = argv + argc;
  ppcVar8 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (argv,end,&local_d8);
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  if (ppcVar8 != end) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-c","");
    ppcVar8 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (argv,end,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    pRVar9 = local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (ppcVar8 != end) {
      print_csv_format<__gnu_cxx::__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>>
                ((__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                  )local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                  )local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(string *)&local_88);
      goto LAB_00103529;
    }
LAB_0010324f:
    local_b8._0_8_ = &std::cout;
    local_b8._8_8_ = "\n";
    if (pRVar9 != local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_d8._M_dataplus._M_p = __endptr._M_p;
        local_d8._M_string_length = (size_type)pRVar9;
        std::ostream_iterator<PrintableRepeat,_char,_std::char_traits<char>_>::operator=
                  ((ostream_iterator<PrintableRepeat,_char,_std::char_traits<char>_> *)local_b8,
                   (PrintableRepeat *)&local_d8);
        pRVar9 = pRVar9 + 1;
      } while (pRVar9 != local_68.
                         super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    goto LAB_00103529;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-n","");
  ppcVar8 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (argv,end,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (ppcVar8 == end) {
    local_90 = 10;
LAB_001032c0:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-p","");
    ppcVar8 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (argv,end,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (ppcVar8 != end) {
      local_b8._0_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-p","");
      get_cmd_option(&local_d8,argv,end,(string *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
      }
      _Var4._M_p = local_d8._M_dataplus._M_p;
      piVar10 = __errno_location();
      local_94 = *piVar10;
      *piVar10 = 0;
      __endptr._M_p = local_b8;
      lVar6 = strtol(_Var4._M_p,(char **)__endptr._M_p,10);
      if ((pointer)local_b8._0_8_ == _Var4._M_p) goto LAB_001035aa;
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar10 != 0x22)) {
        if (*piVar10 == 0) {
          *piVar10 = local_94;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001033e4;
      }
      goto LAB_001035b6;
    }
    lVar6 = 0xffffffff;
LAB_001033e4:
    report_biggest_periods(&local_68,(string *)&local_88,local_90,(int)lVar6);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-l","");
    ppcVar8 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (argv,end,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (ppcVar8 == end) {
      lVar6 = 0xffffffff;
LAB_00103513:
      report_biggest_lengths(&local_68,(string *)&local_88,local_90,(int)lVar6);
LAB_00103529:
      if (local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl.
          super__Vector_impl_data._M_start != (Repeat *)0x0) {
        operator_delete(local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_allocated_capacity != &local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,
                        CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1)
        ;
      }
      return 0;
    }
    local_b8._0_8_ = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-l","");
    get_cmd_option(&local_d8,argv,end,(string *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
    }
    __endptr._M_p = local_d8._M_dataplus._M_p;
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    *piVar10 = 0;
    lVar6 = strtol(__endptr._M_p,(char **)local_b8,10);
    if ((pointer)local_b8._0_8_ != __endptr._M_p) {
      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_001035ce;
      if (*piVar10 == 0) {
        *piVar10 = iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00103513;
    }
  }
  else {
    local_b8._0_8_ = &local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-n","");
    get_cmd_option(&local_d8,argv,end,(string *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
    }
    _Var4._M_p = local_d8._M_dataplus._M_p;
    pRVar9 = (pointer)__errno_location();
    uVar2 = pRVar9->pos;
    __endptr._M_p = (pointer)(ulong)uVar2;
    pRVar9->pos = 0;
    local_90 = strtoull(_Var4._M_p,(char **)local_b8,10);
    if ((pointer)local_b8._0_8_ != _Var4._M_p) {
      if (pRVar9->pos == 0) {
        pRVar9->pos = uVar2;
      }
      else if (pRVar9->pos == 0x22) {
        std::__throw_out_of_range("stoull");
        local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)argv;
        goto LAB_0010324f;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001032c0;
    }
    std::__throw_invalid_argument("stoull");
LAB_001035aa:
    std::__throw_invalid_argument("stoi");
LAB_001035b6:
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_001035ce:
  uVar11 = std::__throw_out_of_range("stoi");
  if ((pointer)local_b8._0_8_ != __endptr._M_p) {
    operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
  }
  if (local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl.
      super__Vector_impl_data._M_start != (Repeat *)0x0) {
    operator_delete(local_68.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

int main(int argc, char** argv)
{
    std::string sequence;
    std::getline(std::cin, sequence);
    capitalise(sequence);
    if (!is_dna(sequence) && !is_rna(sequence)) {
        std::cerr << "this example is only for DNA or RNA sequences" << std::endl;
        exit(0);
    }
    auto repeats = get_repeats(sequence);
    std::clog << "Found " << repeats.size() << " tandem repeats!" << std::endl;
    if (cmd_option_exists(argv, argv + argc, "-a")) {
        if (cmd_option_exists(argv, argv + argc, "-c")) {
            print_csv_format(std::cbegin(repeats), std::cend(repeats), sequence);
        } else {
            print(std::begin(repeats), std::end(repeats), sequence);
        }
    } else {
        std::size_t max_report {10};
        if (cmd_option_exists(argv, argv + argc, "-n")) {
            const std::string user_max_report {get_cmd_option(argv, argv + argc, "-n")};
            max_report = std::stoull(user_max_report);
        }
        int min_period {-1};
        if (cmd_option_exists(argv, argv + argc, "-p")) {
            const std::string user_min_period {get_cmd_option(argv, argv + argc, "-p")};
            min_period = std::stoi(user_min_period);
        }
        report_biggest_periods(repeats, sequence, max_report, min_period);
        int min_length {-1};
        if (cmd_option_exists(argv, argv + argc, "-l")) {
            const std::string user_min_length {get_cmd_option(argv, argv + argc, "-l")};
            min_length = std::stoi(user_min_length);
        }
        report_biggest_lengths(repeats, sequence, max_report, min_length);
    }
}